

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_model_v2.c
# Opt level: O2

MPP_RET reenc_calc_cbr_ratio(void *ctx,EncRcTaskInfo *cfg)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  RK_S32 RVar5;
  RK_S32 RVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  bool bVar18;
  float fVar19;
  double dVar20;
  
  iVar11 = *(int *)((long)ctx + 0x3c);
  RVar5 = mpp_data_sum_v2(*(MppDataV2 **)((long)ctx + 0x208));
  iVar9 = (int)((long)RVar5 / (long)iVar11);
  RVar6 = mpp_data_get_pre_val_v2(*(MppDataV2 **)((long)ctx + 0x208),-1);
  uVar1 = cfg->bit_target;
  uVar2 = cfg->bit_real;
  uVar12 = (long)(int)((iVar9 * iVar11 - RVar6) + uVar2) / (long)iVar11;
  iVar16 = *(int *)((long)ctx + 0x1b8);
  iVar3 = *ctx;
  iVar4 = *(int *)((long)ctx + 4);
  uVar10 = uVar2;
  if ((rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2","enter %p\n","reenc_calc_cbr_ratio");
    uVar10 = cfg->bit_real;
  }
  if (((int)uVar10 < *(int *)((long)ctx + 0x200)) || (*(int *)((long)ctx + 0xc4) != 1)) {
    iVar13 = *(int *)((long)ctx + 0x224) + uVar2;
    if (*(int *)((long)ctx + 0x220) <= iVar13) {
      iVar13 = *(int *)((long)ctx + 0x220);
    }
    iVar13 = iVar13 - *(int *)((long)ctx + 0x110);
    iVar17 = 0;
    if (iVar13 < 1) {
      iVar13 = iVar17;
    }
    uVar10 = uVar2;
    if ((int)uVar1 < (int)uVar2) {
      uVar10 = uVar1;
    }
    iVar7 = (int)((uVar1 - uVar2) * -0x20) / (int)uVar10;
    iVar15 = (int)uVar12;
    uVar10 = (uint)((long)((ulong)(uint)(iVar15 >> 0x1f) << 0x20 | uVar12 & 0xffffffff) /
                   (long)(iVar16 >> 5));
    if (0x3e < (int)uVar10) {
      uVar10 = 0x3f;
    }
    uVar12 = (ulong)uVar10;
    if ((int)uVar10 < 1) {
      uVar12 = 0;
    }
    uVar8 = (uint)((long)((ulong)(uint)(iVar9 >> 0x1f) << 0x20 |
                         (long)RVar5 / (long)iVar11 & 0xffffffffU) / (long)(iVar16 >> 5));
    uVar10 = 0x3f;
    if ((int)uVar8 < 0x3f) {
      uVar10 = uVar8;
    }
    uVar14 = (ulong)uVar10;
    if ((int)uVar10 < 1) {
      uVar14 = 0;
    }
    iVar11 = ((iVar15 - iVar16) * 0x60) / iVar16;
    iVar13 = ((iVar13 - *(int *)((long)ctx + 0x228)) * 0x20) / *(int *)((long)ctx + 0x228);
    if (iVar16 == iVar9 || iVar15 <= iVar9) {
      bVar18 = false;
      if (cfg->frame_type == INTRA_FRAME) {
        iVar16 = (tab_lnx[uVar12] - tab_lnx[uVar14]) * 3;
        iVar9 = 0x100;
        if (iVar16 < 0x100) {
          iVar9 = iVar16;
        }
        iVar17 = -0xc0;
        if (-0xc0 < iVar9) {
          iVar17 = iVar9;
        }
        bVar18 = true;
      }
    }
    else {
      iVar9 = (tab_lnx[uVar12] - tab_lnx[uVar14]) * 6;
      iVar16 = 0x100;
      if (iVar9 < 0x100) {
        iVar16 = iVar9;
      }
      iVar17 = -0xc0;
      if (-0xc0 < iVar16) {
        iVar17 = iVar16;
      }
      bVar18 = cfg->frame_type == INTRA_FRAME;
    }
    iVar16 = 0x100;
    if (iVar7 < 0x100) {
      iVar16 = iVar7;
    }
    iVar9 = -0x80;
    if (-0x80 < iVar16) {
      iVar9 = iVar16;
    }
    if (0x1f < iVar11) {
      iVar11 = 0x20;
    }
    if (iVar11 < -0x1f) {
      iVar11 = -0x20;
    }
    iVar16 = 0x20;
    if (iVar13 < 0x20) {
      iVar16 = iVar13;
    }
    if (iVar16 < -0x1f) {
      iVar16 = -0x20;
    }
    iVar17 = iVar16 + iVar9 + iVar11 + iVar17;
    *(int *)((long)ctx + 0x230) = iVar17;
    if ((bVar18) && (iVar11 = cfg->madi, 0 < iVar11)) {
      dVar20 = log((double)((long)(int)uVar1 / (long)((iVar4 + 0xf >> 4) * (iVar3 + 0xf >> 4)) &
                           0xffffffff));
      fVar19 = ((float)iVar11 * 0.0438 - (float)dVar20) * 6.9686413 + 60.832054;
      if ((float)(*(int *)((long)ctx + 0x24c) >> 6) < (float)(int)fVar19) {
        iVar17 = (int)fVar19 * 0x40 - *(int *)((long)ctx + 0x24c);
        *(int *)((long)ctx + 0x230) = iVar17;
      }
    }
    if ((rc_debug & 0x40) != 0) {
      _mpp_log_l(4,"rc_model_v2","cbr target_bit %d real_bit %d reenc next ratio %d",
                 "reenc_calc_cbr_ratio",(ulong)uVar1,(ulong)uVar2,iVar17);
    }
    if ((rc_debug & 1) != 0) {
      _mpp_log_l(4,"rc_model_v2","leave %p\n","reenc_calc_cbr_ratio",ctx);
    }
  }
  else {
    reenc_calc_super_frm_ratio(ctx,cfg);
  }
  return MPP_OK;
}

Assistant:

MPP_RET reenc_calc_cbr_ratio(void *ctx, EncRcTaskInfo *cfg)
{
    RcModelV2Ctx *p = (RcModelV2Ctx *)ctx;
    RcCfg *usr_cfg = &p->usr_cfg;
    RK_S32 stat_time = usr_cfg->stats_time;
    RK_S32 pre_ins_bps = mpp_data_sum_v2(p->stat_bits) / stat_time;
    RK_S32 ins_bps = (pre_ins_bps * stat_time - mpp_data_get_pre_val_v2(p->stat_bits, -1) + cfg->bit_real) / stat_time;
    RK_S32 real_bit = cfg->bit_real;
    RK_S32 target_bit = cfg->bit_target;
    RK_S32 target_bps = p->target_bps;
    RK_S32 water_level = 0;
    RK_S32 idx1, idx2;
    RK_S32 bit_diff_ratio, ins_ratio, bps_ratio, wl_ratio;
    RK_S32 mb_w = MPP_ALIGN(usr_cfg->width, 16) / 16;
    RK_S32 mb_h = MPP_ALIGN(usr_cfg->height, 16) / 16;

    rc_dbg_func("enter %p\n", p);

    if (p->cur_super_thd <= cfg->bit_real &&
        usr_cfg->super_cfg.rc_priority == MPP_ENC_RC_BY_FRM_SIZE_FIRST) {
        return reenc_calc_super_frm_ratio(ctx, cfg);
    }

    if (real_bit + p->stat_watl > p->watl_thrd)
        water_level = p->watl_thrd - p->bit_per_frame;
    else
        water_level = real_bit + p->stat_watl - p->bit_per_frame;

    if (water_level < 0) {
        water_level = 0;
    }

    if (target_bit > real_bit)
        bit_diff_ratio = 32 * (real_bit - target_bit) / real_bit;
    else
        bit_diff_ratio = 32 * (real_bit - target_bit) / target_bit;

    idx1 = ins_bps / (target_bps >> 5);
    idx2 = pre_ins_bps / (target_bps >> 5);

    idx1 = mpp_clip(idx1, 0, 63);
    idx2 = mpp_clip(idx2, 0, 63);
    ins_ratio = tab_lnx[idx1] - tab_lnx[idx2];

    bps_ratio = 96 * (ins_bps - target_bps) / target_bps;
    wl_ratio = 32 * (water_level - p->watl_base) /  p->watl_base;
    if (pre_ins_bps < ins_bps && target_bps != pre_ins_bps) {
        ins_ratio = 6 * ins_ratio;
        ins_ratio = mpp_clip(ins_ratio, -192, 256);
    } else {
        if (cfg->frame_type == INTRA_FRAME) {
            ins_ratio = 3 * ins_ratio;
            ins_ratio = mpp_clip(ins_ratio, -192, 256);
        } else {
            ins_ratio = 0;
        }
    }

    bit_diff_ratio = mpp_clip(bit_diff_ratio, -128, 256);
    bps_ratio = mpp_clip(bps_ratio, -32, 32);
    wl_ratio  = mpp_clip(wl_ratio, -32, 32);
    p->next_ratio = bit_diff_ratio + ins_ratio + bps_ratio + wl_ratio;
    if (cfg->frame_type  == INTRA_FRAME && (cfg->madi > 0)) {
        RK_U32 tar_bpp = target_bit / (mb_w * mb_h);
        float lnb_t = log(tar_bpp);
        float c = 6.7204, a = -0.1435, b = 0.0438;
        float start_qp = (p->cur_scale_qp >> 6);
        int qp_c = ((lnb_t - cfg->madi * b - c) / a + 14);
        if (qp_c > start_qp)
            p->next_ratio  = (qp_c << 6) - p->cur_scale_qp;
    }
    rc_dbg_rc("cbr target_bit %d real_bit %d reenc next ratio %d", target_bit, real_bit, p->next_ratio);
    rc_dbg_func("leave %p\n", p);
    return MPP_OK;
}